

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32m68k.c
# Opt level: O2

uint8_t m68k_reloc_elf2vlink(uint8_t rtype,RelocInsert *ri)

{
  if (rtype < 0x17) {
    ri->bpos = 0;
    ri->bsiz = m68k_reloc_elf2vlink::convertV4[rtype].bsiz;
    ri->mask = -1;
    return m68k_reloc_elf2vlink::convertV4[rtype].rtype;
  }
  return '\0';
}

Assistant:

static uint8_t m68k_reloc_elf2vlink(uint8_t rtype,struct RelocInsert *ri)
/* Determine vlink internal reloc type from ELF reloc type and fill in
   reloc-insert description informations.
   All fields of the RelocInsert structure are preset to zero. */
{
  static struct ELF2vlink convertV4[] = {
    R_NONE,0,0,-1,
    R_ABS,0,32,-1,              /* R_68K_32 */
    R_ABS,0,16,-1,              /* R_68K_16 */
    R_ABS,0,8,-1,               /* R_68K_8 */
    R_PC,0,32,-1,               /* R_68K_PC32 */
    R_PC,0,16,-1,               /* R_68K_PC16 */
    R_PC,0,8,-1,                /* R_68K_PC8 */
    R_GOT,0,32,-1,              /* R_68K_GOT32 */
    R_GOT,0,16,-1,              /* R_68K_GOT16 */
    R_GOT,0,8,-1,               /* R_68K_GOT8 */
    R_GOTOFF,0,32,-1,           /* R_68K_GOT32O */
    R_GOTOFF,0,16,-1,           /* R_68K_GOT16O */
    R_GOTOFF,0,8,-1,            /* R_68K_GOT8O */
    R_PLT,0,32,-1,              /* R_68K_PLT32 */
    R_PLT,0,16,-1,              /* R_68K_PLT16 */
    R_PLT,0,8,-1,               /* R_68K_PLT8 */
    R_PLTOFF,0,32,-1,           /* R_68K_PLT32O */
    R_PLTOFF,0,16,-1,           /* R_68K_PLT16O */
    R_PLTOFF,0,8,-1,            /* R_68K_PLT8O */
    R_COPY,0,32,-1,             /* R_68K_COPY */
    R_GLOBDAT,0,32,-1,          /* R_68K_GLOB_DAT */
    R_JMPSLOT,0,0,-1,           /* R_68K_JMP_SLOT */
    R_LOADREL,0,32,-1           /* R_68K_RELATIVE */
  };

  if (rtype <= R_68K_RELATIVE) {
    ri->bpos = convertV4[rtype].bpos;
    ri->bsiz = convertV4[rtype].bsiz;
    ri->mask = convertV4[rtype].mask;
    rtype = convertV4[rtype].rtype;
  }
  else
    rtype = R_NONE;

  return (rtype);
}